

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.c
# Opt level: O1

int quicly_loss_detect_loss
              (quicly_loss_t *loss,int64_t now,uint32_t max_ack_delay,int is_1rtt_only,
              quicly_loss_on_detect_cb on_loss_detected)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  anon_union_24_13_c7673ae4_for_data *paVar7;
  long lVar8;
  quicly_sentmap_iter_t iter;
  int local_64;
  quicly_sentmap_iter_t local_58;
  ulong local_40;
  quicly_sentmap_t *local_38;
  
  uVar1 = (loss->rtt).smoothed;
  uVar2 = (loss->rtt).latest;
  if (uVar1 < uVar2) {
    uVar1 = uVar2;
  }
  loss->loss_time = 0x7fffffffffffffff;
  iVar4 = quicly_loss_init_sentmap_iter(loss,&local_58,now,max_ack_delay,0);
  if (iVar4 == 0) {
    local_40 = (ulong)(uVar1 * 9 + 7 >> 3);
    lVar8 = now - local_40;
    local_38 = &loss->sentmap;
    do {
      if ((local_58.p)->acked != quicly_sentmap__type_packet) goto LAB_0012ba4c;
      paVar7 = &(local_58.p)->data;
      lVar3 = ((local_58.p)->data).stream.stream_id;
      if (lVar3 == -1) goto LAB_0012b989;
      if ((lVar3 < (long)(loss->largest_acked_packet_plus1[((local_58.p)->data).packet.ack_epoch] -
                         1)) &&
         ((lVar6 = loss->largest_acked_packet_plus1[((local_58.p)->data).packet.ack_epoch] - 4,
          lVar3 <= lVar6 || (((local_58.p)->data).packet.sent_at <= lVar8)))) {
        if (((local_58.p)->data).packet.cc_bytes_in_flight == 0) {
LAB_0012b96d:
          quicly_sentmap_skip(&local_58);
        }
        else {
          (*on_loss_detected)(loss,(quicly_sent_packet_t *)paVar7,SUB14(lVar6 < lVar3,0));
          iVar4 = quicly_sentmap_update(local_38,&local_58,QUICLY_SENTMAP_EVENT_LOST);
          if (iVar4 != 0) {
            iVar5 = 1;
            local_64 = iVar4;
            goto LAB_0012b97c;
          }
        }
        iVar5 = 0;
      }
      else {
        iVar5 = 3;
        if (is_1rtt_only == 0) goto LAB_0012b96d;
      }
LAB_0012b97c:
    } while (iVar5 == 0);
    iVar4 = local_64;
    if (iVar5 == 3) {
LAB_0012b989:
      if (is_1rtt_only == 0) {
        iVar4 = quicly_loss_init_sentmap_iter(loss,&local_58,now,max_ack_delay,0);
        if (iVar4 != 0) {
          return iVar4;
        }
        if ((local_58.p)->acked != quicly_sentmap__type_packet) {
LAB_0012ba4c:
          __assert_fail("iter->p->acked == quicly_sentmap__type_packet",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/sentmap.h"
                        ,0x13c,
                        "const quicly_sent_packet_t *quicly_sentmap_get(quicly_sentmap_iter_t *)");
        }
        paVar7 = &(local_58.p)->data;
      }
      lVar8 = (paVar7->packet).sent_at;
      iVar4 = 0;
      if (lVar8 != 0x7fffffffffffffff) {
        do {
          if (loss->largest_acked_packet_plus1[(paVar7->packet).ack_epoch] <=
              (paVar7->packet).packet_number + 1) break;
          if ((paVar7->packet).cc_bytes_in_flight != 0) {
            if ((long)(lVar8 + local_40) <= now) {
              __assert_fail("now < sent->sent_at + delay_until_lost",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/loss.c"
                            ,0x5e,
                            "int quicly_loss_detect_loss(quicly_loss_t *, int64_t, uint32_t, int, quicly_loss_on_detect_cb)"
                           );
            }
            loss->loss_time = lVar8 + local_40;
            break;
          }
          quicly_sentmap_skip(&local_58);
          if ((local_58.p)->acked != quicly_sentmap__type_packet) goto LAB_0012ba4c;
          lVar8 = ((local_58.p)->data).packet.sent_at;
          paVar7 = &(local_58.p)->data;
        } while (lVar8 != 0x7fffffffffffffff);
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

int quicly_loss_detect_loss(quicly_loss_t *loss, int64_t now, uint32_t max_ack_delay, int is_1rtt_only,
                            quicly_loss_on_detect_cb on_loss_detected)
{
    /* This function ensures that the value returned in loss_time is when the next application timer should be set for loss
     * detection. if no timer is required, loss_time is set to INT64_MAX. */

    const uint32_t delay_until_lost = ((loss->rtt.latest > loss->rtt.smoothed ? loss->rtt.latest : loss->rtt.smoothed) * 9 + 7) / 8;
    quicly_sentmap_iter_t iter;
    const quicly_sent_packet_t *sent;
    int ret;

    loss->loss_time = INT64_MAX;

    if ((ret = quicly_loss_init_sentmap_iter(loss, &iter, now, max_ack_delay, 0)) != 0)
        return ret;

    /* Mark packets as lost if they are smaller than the largest_acked and outside either time-threshold or packet-threshold
     * windows. Once marked as lost, cc_bytes_in_flight becomes zero. */
    while ((sent = quicly_sentmap_get(&iter))->packet_number != UINT64_MAX) {
        int64_t largest_acked_signed = loss->largest_acked_packet_plus1[sent->ack_epoch] - 1;
        if ((int64_t)sent->packet_number < largest_acked_signed &&
            (sent->sent_at <= now - delay_until_lost ||                                                      /* time threshold */
             (int64_t)sent->packet_number <= largest_acked_signed - QUICLY_LOSS_DEFAULT_PACKET_THRESHOLD)) { /* packet threshold */
            if (sent->cc_bytes_in_flight != 0) {
                on_loss_detected(loss, sent,
                                 (int64_t)sent->packet_number > largest_acked_signed - QUICLY_LOSS_DEFAULT_PACKET_THRESHOLD);
                if ((ret = quicly_sentmap_update(&loss->sentmap, &iter, QUICLY_SENTMAP_EVENT_LOST)) != 0)
                    return ret;
            } else {
                quicly_sentmap_skip(&iter);
            }
        } else {
            /* When only one PN space is active, it is possible to stop looking for packets that have to be considered lost and
             * continue on to calculating the loss time. Otherwise, iterate through the entire sentmap. */
            if (is_1rtt_only)
                break;
            quicly_sentmap_skip(&iter);
        }
    }

    if (!is_1rtt_only) {
        if ((ret = quicly_loss_init_sentmap_iter(loss, &iter, now, max_ack_delay, 0)) != 0)
            return ret;
        sent = quicly_sentmap_get(&iter);
    }

    /* schedule time-threshold alarm if there is a packet outstanding that is smaller than largest_acked */
    while (sent->sent_at != INT64_MAX && sent->packet_number + 1 < loss->largest_acked_packet_plus1[sent->ack_epoch]) {
        if (sent->cc_bytes_in_flight != 0) {
            assert(now < sent->sent_at + delay_until_lost);
            loss->loss_time = sent->sent_at + delay_until_lost;
            break;
        }
        quicly_sentmap_skip(&iter);
        sent = quicly_sentmap_get(&iter);
    }

    return 0;
}